

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedH264TrackData::extractData(ParsedH264TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  VodCoreException *pVVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint local_3fc;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream ss_1;
  uint32_t *cur32_1;
  uint8_t *puStack_200;
  uint32_t elSize_1;
  uint8_t *dst;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream ss;
  uint32_t *cur32;
  uint32_t elSize;
  int elements;
  uint8_t *end;
  uint8_t *curPos;
  int newBufSize;
  int size_local;
  uint8_t *buff_local;
  AVPacket *pkt_local;
  ParsedH264TrackData *this_local;
  
  puVar7 = buff + size;
  cur32._4_4_ = 0;
  if (((this->m_firstExtract & 1U) != 0) &&
     (uVar1 = (*(this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData[5])
                        (this,buff,(ulong)(uint)size), (uVar1 & 1) != 0)) {
    this->m_firstExtract = false;
  }
  end = buff;
  curPos._0_4_ = size;
  if ((this->m_firstExtract & 1U) != 0) {
    sVar3 = getSPSPPSLen(this);
    curPos._0_4_ = (int)sVar3 + size;
  }
  do {
    if (puVar7 + -(long)(int)(uint)this->m_nalSize < end) {
      if (end != puVar7) {
        __assert_fail("curPos == end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                      ,0x8d,
                      "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)"
                     );
      }
      if (puVar7 < end) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Matroska parse error: invalid H264 NAL unit size. NAL unit truncated."
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      iVar2 = cur32._4_4_ * (4 - (uint)this->m_nalSize) + (int)curPos;
      puVar6 = (uint8_t *)operator_new__((long)iVar2);
      pkt->data = puVar6;
      pkt->size = iVar2;
      puStack_200 = pkt->data;
      end = buff;
      if ((this->m_firstExtract & 1U) != 0) {
        iVar2 = writeSPSPPS(this,puStack_200);
        puStack_200 = puStack_200 + iVar2;
      }
      while( true ) {
        if (puVar7 + -(long)(int)(uint)this->m_nalSize < end) {
          this->m_firstExtract = false;
          return;
        }
        if (this->m_nalSize == '\x04') {
          cur32_1._4_4_ = my_ntohl(*(uint32_t *)end);
        }
        else if (this->m_nalSize == '\x03') {
          cur32_1._4_4_ = (uint)*end * 0x10000 + (uint)end[1] * 0x100 + (uint)end[2];
        }
        else {
          if (this->m_nalSize != '\x02') {
            std::__cxx11::ostringstream::ostringstream(local_388);
            poVar4 = std::operator<<((ostream *)local_388,"Unsupported nal unit size ");
            std::ostream::operator<<(poVar4,0);
            pVVar5 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar5,3,&local_3a8);
            __cxa_throw(pVVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          cur32_1._4_4_ = (uint)*end * 0x100 + (uint)end[1];
        }
        writeNalHeader(&stack0xfffffffffffffe00);
        if ((end[this->m_nalSize] & 0x80) != 0) break;
        if ((uint)((int)puVar7 - (int)end) < cur32_1._4_4_) {
          local_3fc = (int)puVar7 - (int)end;
        }
        else {
          local_3fc = cur32_1._4_4_;
        }
        memcpy(puStack_200,end + (int)(uint)this->m_nalSize,(ulong)local_3fc);
        end = end + (cur32_1._4_4_ + this->m_nalSize);
        puStack_200 = puStack_200 + cur32_1._4_4_;
      }
      __assert_fail("(curPos[m_nalSize] & 0x80) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                    ,0xab,
                    "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)"
                   );
    }
    if (this->m_nalSize == '\x04') {
      cur32._0_4_ = my_ntohl(*(uint32_t *)end);
    }
    else if (this->m_nalSize == '\x03') {
      cur32._0_4_ = (uint)*end * 0x10000 + (uint)end[1] * 0x100 + (uint)end[2];
    }
    else {
      if (this->m_nalSize != '\x02') {
        std::__cxx11::ostringstream::ostringstream(local_1c0);
        poVar4 = std::operator<<((ostream *)local_1c0,"Unsupported nal unit size ");
        std::ostream::operator<<(poVar4,0);
        dst._7_1_ = 1;
        pVVar5 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar5,3,&local_1f0);
        dst._7_1_ = 0;
        __cxa_throw(pVVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      cur32._0_4_ = (uint)*end * 0x100 + (uint)end[1];
    }
    cur32._4_4_ = cur32._4_4_ + 1;
    end = end + ((uint32_t)cur32 + this->m_nalSize);
  } while( true );
}

Assistant:

void ParsedH264TrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    int newBufSize = size;
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    int elements = 0;

    if (m_firstExtract && spsppsExists(buff, size))
        m_firstExtract = false;

    if (m_firstExtract)
        newBufSize += static_cast<int>(getSPSPPSLen());

    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        elements++;
        curPos += elSize + m_nalSize;
    }
    assert(curPos == end);
    if (curPos > end)
    {
        LTRACE(LT_ERROR, 2, "Matroska parse error: invalid H264 NAL unit size. NAL unit truncated.");
    }
    newBufSize += elements * (4 - m_nalSize);
    pkt->data = new uint8_t[newBufSize];
    pkt->size = newBufSize;

    uint8_t* dst = pkt->data;
    if (m_firstExtract)
    {
        dst += writeSPSPPS(dst);
    }
    curPos = buff;
    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        writeNalHeader(dst);
        assert((curPos[m_nalSize] & 0x80) == 0);
        memcpy(dst, curPos + m_nalSize, FFMIN(elSize, (uint32_t)(end - curPos)));
        curPos += elSize + m_nalSize;
        dst += elSize;
    }
    m_firstExtract = false;
}